

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O0

string * chaiscript::Boxed_Number::to_string_aux<long_double>(Boxed_Value *v)

{
  longdouble *plVar1;
  string *in_RDI;
  ostringstream oss;
  ostringstream local_188 [392];
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  plVar1 = (longdouble *)Boxed_Value::get_const_ptr((Boxed_Value *)0x38f380);
  std::ostream::operator<<(local_188,*plVar1);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return in_RDI;
}

Assistant:

static std::string to_string_aux(const Boxed_Value &v)
        {
          std::ostringstream oss;
          oss << *static_cast<const Source *>(v.get_const_ptr());
          return oss.str();
        }